

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<no_legacy_generate::MainVisitor&>
          (Delay3Control *this,AlwaysFFVisitor *visitor)

{
  Expression *in_RSI;
  AlwaysFFVisitor *in_RDI;
  
  Expression::visit<no_legacy_generate::MainVisitor&>(in_RSI,in_RDI);
  if ((in_RDI->errorLocation).super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceLocation>._M_payload !=
      (_Storage<slang::SourceLocation,_true>)0x0) {
    Expression::visit<no_legacy_generate::MainVisitor&>(in_RSI,in_RDI);
  }
  if (*(long *)&(in_RDI->errorLocation).super__Optional_base<slang::SourceLocation,_true,_true>.
                _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_engaged != 0) {
    Expression::visit<no_legacy_generate::MainVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }